

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int libssh2_sftp_statvfs(LIBSSH2_SFTP *sftp,char *path,size_t path_len,LIBSSH2_SFTP_STATVFS *st)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  LIBSSH2_SFTP_STATVFS *pLVar2;
  uint32_t uVar3;
  int iVar4;
  time_t start_time;
  uchar *buf;
  ulong uVar5;
  libssh2_uint64_t lVar6;
  libssh2_uint64_t lVar7;
  char *errmsg;
  ulong buflen;
  uchar *s;
  size_t data_len;
  size_t in_stack_ffffffffffffff88;
  char *local_70;
  uchar *local_68;
  uchar *local_60;
  LIBSSH2_SFTP_STATVFS *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  iVar4 = -0x27;
  if (st != (LIBSSH2_SFTP_STATVFS *)0x0 && sftp != (LIBSSH2_SFTP *)0x0) {
    local_58 = st;
    local_38 = path;
    start_time = time((time_t *)0x0);
    buflen = (ulong)((int)path_len + 0x24);
    local_48 = path_len & 0xffffffff;
    local_40 = (ulong)((int)path_len + 0x20);
    local_50 = buflen;
    do {
      channel = sftp->channel;
      pLVar1 = channel->session;
      local_60 = (uchar *)0x0;
      local_70 = (char *)0x0;
      if (sftp->statvfs_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        buf = (uchar *)(*pLVar1->alloc)(buflen,&pLVar1->abstract);
        if (buf != (uchar *)0x0) {
          local_68 = buf;
          _libssh2_store_u32(&local_68,(uint32_t)local_40);
          *local_68 = 200;
          uVar3 = sftp->request_id;
          sftp->request_id = uVar3 + 1;
          sftp->statvfs_request_id = uVar3;
          local_68 = local_68 + 1;
          _libssh2_store_u32(&local_68,uVar3);
          _libssh2_store_str(&local_68,"statvfs@openssh.com",0x13);
          buflen = local_50;
          _libssh2_store_str(&local_68,local_38,local_48);
          sftp->statvfs_state = libssh2_NB_state_created;
          goto LAB_00126223;
        }
        iVar4 = -6;
        errmsg = "Unable to allocate memory for FXP_EXTENDED packet";
        local_68 = (uchar *)0x0;
LAB_001263a9:
        iVar4 = _libssh2_error(pLVar1,iVar4,errmsg);
      }
      else {
        buf = sftp->statvfs_packet;
LAB_00126223:
        if (sftp->statvfs_state != libssh2_NB_state_created) {
LAB_0012628f:
          iVar4 = sftp_packet_requirev
                            (sftp,0x133471,(uchar *)(ulong)sftp->statvfs_request_id,
                             (uint32_t)&local_70,&local_60,(size_t *)0x9,in_stack_ffffffffffffff88);
          if (iVar4 == 0) {
            if (*local_70 == 'e') {
              uVar3 = _libssh2_ntohu32((uchar *)(local_70 + 5));
              sftp->statvfs_state = libssh2_NB_state_idle;
              (*pLVar1->free)(local_70,&pLVar1->abstract);
              sftp->last_errno = uVar3;
              iVar4 = -0x1f;
              errmsg = "SFTP Protocol Error";
            }
            else {
              if ((uchar *)0x5c < local_60) {
                sftp->statvfs_state = libssh2_NB_state_idle;
                lVar6 = _libssh2_ntohu64((uchar *)(local_70 + 5));
                pLVar2 = local_58;
                local_58->f_bsize = lVar6;
                lVar6 = _libssh2_ntohu64((uchar *)(local_70 + 0xd));
                pLVar2->f_frsize = lVar6;
                lVar6 = _libssh2_ntohu64((uchar *)(local_70 + 0x15));
                pLVar2->f_blocks = lVar6;
                lVar6 = _libssh2_ntohu64((uchar *)(local_70 + 0x1d));
                pLVar2->f_bfree = lVar6;
                lVar6 = _libssh2_ntohu64((uchar *)(local_70 + 0x25));
                pLVar2->f_bavail = lVar6;
                lVar6 = _libssh2_ntohu64((uchar *)(local_70 + 0x2d));
                pLVar2->f_files = lVar6;
                lVar6 = _libssh2_ntohu64((uchar *)(local_70 + 0x35));
                pLVar2->f_ffree = lVar6;
                lVar6 = _libssh2_ntohu64((uchar *)(local_70 + 0x3d));
                pLVar2->f_favail = lVar6;
                lVar6 = _libssh2_ntohu64((uchar *)(local_70 + 0x45));
                pLVar2->f_fsid = lVar6;
                lVar6 = _libssh2_ntohu64((uchar *)(local_70 + 0x4d));
                lVar7 = _libssh2_ntohu64((uchar *)(local_70 + 0x55));
                pLVar2->f_namemax = lVar7;
                pLVar2->f_flag = (ulong)((uint)lVar6 & 3);
                (*pLVar1->free)(local_70,&pLVar1->abstract);
                iVar4 = 0;
                goto LAB_001263ae;
              }
              (*pLVar1->free)(local_70,&pLVar1->abstract);
              sftp->statvfs_state = libssh2_NB_state_idle;
              iVar4 = -0x1f;
              errmsg = "SFTP Protocol Error: short response";
            }
          }
          else {
            if (iVar4 == -0x25) goto LAB_001263ae;
            if (iVar4 == -0x26) {
              if (local_60 != (uchar *)0x0) {
                (*pLVar1->free)(local_70,&pLVar1->abstract);
              }
              iVar4 = -0x1f;
              errmsg = "SFTP fstat packet too short";
            }
            else {
              sftp->statvfs_state = libssh2_NB_state_idle;
              errmsg = "Error waiting for FXP EXTENDED REPLY";
            }
          }
          goto LAB_001263a9;
        }
        uVar5 = _libssh2_channel_write(channel,0,buf,buflen);
        if (uVar5 != 0xffffffffffffffdb && buflen <= uVar5) {
          (*pLVar1->free)(buf,&pLVar1->abstract);
          sftp->statvfs_packet = (uchar *)0x0;
          if ((long)uVar5 < 0) {
            sftp->statvfs_state = libssh2_NB_state_idle;
            iVar4 = -7;
            errmsg = "_libssh2_channel_write() failed";
            goto LAB_001263a9;
          }
          sftp->statvfs_state = libssh2_NB_state_sent;
          goto LAB_0012628f;
        }
        sftp->statvfs_packet = buf;
        iVar4 = -0x25;
      }
LAB_001263ae:
      if (iVar4 != -0x25) {
        return iVar4;
      }
      pLVar1 = sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar4 = _libssh2_wait_socket(pLVar1,start_time);
    } while (iVar4 == 0);
  }
  return iVar4;
}

Assistant:

static int sftp_statvfs(LIBSSH2_SFTP *sftp, const char *path,
                        unsigned int path_len, LIBSSH2_SFTP_STATVFS *st)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    /* 17 = packet_len(4) + packet_type(1) + request_id(4) + ext_len(4)
       + path_len (4) */
    /* 19 = strlen ("statvfs@openssh.com") */
    uint32_t packet_len = path_len + 19 + 17;
    unsigned char *packet, *s, *data = NULL;
    ssize_t rc;
    unsigned int flag;
    static const unsigned char responses[2] =
        { SSH_FXP_EXTENDED_REPLY, SSH_FXP_STATUS };

    if(sftp->statvfs_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Getting file system statistics of %s", path));
        s = packet = LIBSSH2_ALLOC(session, packet_len);
        if(!packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for FXP_EXTENDED "
                                  "packet");
        }

        _libssh2_store_u32(&s, packet_len - 4);
        *(s++) = SSH_FXP_EXTENDED;
        sftp->statvfs_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->statvfs_request_id);
        _libssh2_store_str(&s, "statvfs@openssh.com", 19);
        _libssh2_store_str(&s, path, path_len);

        sftp->statvfs_state = libssh2_NB_state_created;
    }
    else {
        packet = sftp->statvfs_packet;
    }

    if(sftp->statvfs_state == libssh2_NB_state_created) {
        rc = _libssh2_channel_write(channel, 0, packet, packet_len);
        if(rc == LIBSSH2_ERROR_EAGAIN ||
            (0 <= rc && rc < (ssize_t)packet_len)) {
            sftp->statvfs_packet = packet;
            return LIBSSH2_ERROR_EAGAIN;
        }

        LIBSSH2_FREE(session, packet);
        sftp->statvfs_packet = NULL;

        if(rc < 0) {
            sftp->statvfs_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "_libssh2_channel_write() failed");
        }
        sftp->statvfs_state = libssh2_NB_state_sent;
    }

    rc = sftp_packet_requirev(sftp, 2, responses, sftp->statvfs_request_id,
                              &data, &data_len, 9);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return (int)rc;
    }
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP fstat packet too short");
    }
    else if(rc) {
        sftp->statvfs_state = libssh2_NB_state_idle;
        return _libssh2_error(session, (int)rc,
                              "Error waiting for FXP EXTENDED REPLY");
    }

    if(data[0] == SSH_FXP_STATUS) {
        uint32_t retcode = _libssh2_ntohu32(data + 5);
        sftp->statvfs_state = libssh2_NB_state_idle;
        LIBSSH2_FREE(session, data);
        sftp->last_errno = retcode;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error");
    }

    if(data_len < 93) {
        LIBSSH2_FREE(session, data);
        sftp->statvfs_state = libssh2_NB_state_idle;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error: short response");
    }

    sftp->statvfs_state = libssh2_NB_state_idle;

    st->f_bsize = _libssh2_ntohu64(data + 5);
    st->f_frsize = _libssh2_ntohu64(data + 13);
    st->f_blocks = _libssh2_ntohu64(data + 21);
    st->f_bfree = _libssh2_ntohu64(data + 29);
    st->f_bavail = _libssh2_ntohu64(data + 37);
    st->f_files = _libssh2_ntohu64(data + 45);
    st->f_ffree = _libssh2_ntohu64(data + 53);
    st->f_favail = _libssh2_ntohu64(data + 61);
    st->f_fsid = _libssh2_ntohu64(data + 69);
    flag = (unsigned int)_libssh2_ntohu64(data + 77);
    st->f_namemax = _libssh2_ntohu64(data + 85);

    st->f_flag = (flag & SSH_FXE_STATVFS_ST_RDONLY)
        ? LIBSSH2_SFTP_ST_RDONLY : 0;
    st->f_flag |= (flag & SSH_FXE_STATVFS_ST_NOSUID)
        ? LIBSSH2_SFTP_ST_NOSUID : 0;

    LIBSSH2_FREE(session, data);
    return 0;
}